

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation
          (GeneratedCodeInfo_Annotation *this)

{
  Arena *pAVar1;
  GeneratedCodeInfo_Annotation *this_local;
  
  pAVar1 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  if (pAVar1 == (Arena *)0x0) {
    SharedDtor(this);
    internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
  }
  RepeatedField<int>::~RepeatedField(&this->path_);
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation() {
  // @@protoc_insertion_point(destructor:google.protobuf.GeneratedCodeInfo.Annotation)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}